

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullTransport.cpp
# Opt level: O0

void __thiscall adios2::transport::NullTransport::NullTransport(NullTransport *this,Comm *comm)

{
  NullTransportImpl *this_00;
  undefined8 *in_RDI;
  pointer __p;
  allocator *comm_00;
  string *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  Transport *in_stack_ffffffffffffffa0;
  allocator local_31;
  string local_30 [48];
  
  comm_00 = &local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"NULL",comm_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff98,"NULL",(allocator *)&stack0xffffffffffffff97);
  Transport::Transport
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             (Comm *)comm_00);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  *in_RDI = &PTR__NullTransport_011358f8;
  __p = (pointer)(in_RDI + 0x1e);
  this_00 = (NullTransportImpl *)operator_new(0x18);
  NullTransportImpl::NullTransportImpl(this_00);
  std::
  unique_ptr<adios2::transport::NullTransport::NullTransportImpl,std::default_delete<adios2::transport::NullTransport::NullTransportImpl>>
  ::unique_ptr<std::default_delete<adios2::transport::NullTransport::NullTransportImpl>,void>
            ((unique_ptr<adios2::transport::NullTransport::NullTransportImpl,_std::default_delete<adios2::transport::NullTransport::NullTransportImpl>_>
              *)this_00,__p);
  return;
}

Assistant:

NullTransport::NullTransport(helper::Comm const &comm)
: Transport("NULL", "NULL", comm), Impl(new NullTransportImpl)
{
}